

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CManager_conflict INT_CManager_create_control(char *control_module)

{
  __int32_t *p_Var1;
  __pid_t _Var2;
  int iVar3;
  CManager cm;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  CMControlList p_Var8;
  CMincoming_format_list p_Var9;
  CMFormat *pp_Var10;
  _pending_format_requests *p_Var11;
  CMConnection_conflict *pp_Var12;
  char cVar13;
  char *pcVar14;
  
  cm = (CManager)INT_CMmalloc(0x150);
  if (atl_mutex_initialized == '\0') {
    atl_mutex_initialized = '\x01';
    pthread_mutex_init((pthread_mutex_t *)&atl_mutex,(pthread_mutexattr_t *)0x0);
    atl_install_mutex_funcs(atl_mutex_lock,atl_mutex_unlock,&atl_mutex);
  }
  if (cm == (CManager)0x0) {
    return (CManager_conflict)0x0;
  }
  memset(cm,0,0x150);
  CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
  CM_CMANAGER_ID = attr_atom_from_string("CM_CMANAGER_ID");
  CM_NETWORK_POSTFIX = attr_atom_from_string("CM_NETWORK_POSTFIX");
  CM_CONN_BLOCKING = attr_atom_from_string("CM_CONN_BLOCKING");
  CM_REBWM_RLEN = attr_atom_from_string("CM_REG_BW_RUN_LEN");
  CM_REBWM_REPT = attr_atom_from_string("CM_REG_BW_REPEAT_CNT");
  CM_BW_MEASURE_INTERVAL = attr_atom_from_string("CM_BW_MEASURE_INTERVAL");
  CM_BW_MEASURE_TASK = attr_atom_from_string("CM_BW_MEASURE_TASK");
  CM_BW_MEASURED_VALUE = attr_atom_from_string("CM_BW_MEASURED_VALUE");
  CM_BW_MEASURED_COF = attr_atom_from_string("CM_BW_MEASURED_COF");
  CM_BW_MEASURE_SIZE = attr_atom_from_string("CM_BW_MEASURE_SIZE");
  CM_BW_MEASURE_SIZEINC = attr_atom_from_string("CM_BW_MEASURE_SIZEINC");
  CM_EVENT_SIZE = attr_atom_from_string("CM_EVENT_SIZE");
  CM_INCOMING_CONNECTION = attr_atom_from_string("CM_INCOMING_CONNECTION");
  CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
  CM_IP_INTERFACE = attr_atom_from_string();
  cm->transports = (transport_entry_conflict *)0x0;
  cm->initialized = 0;
  cm->reference_count = 1;
  _Var2 = getpid();
  tVar4 = time((time_t *)0x0);
  srand48(_Var2 + tVar4);
  lVar5 = lrand48();
  cm->CManager_ID = (int)lVar5;
  pcVar6 = getenv("CMControlModule");
  if (pcVar6 != (char *)0x0) {
    control_module = pcVar6;
  }
  if (control_module == (char *)0x0) {
LAB_00118885:
    cm->control_module_choice = "epoll";
  }
  else {
    pcVar6 = strdup(control_module);
    cVar13 = *pcVar6;
    if (cVar13 != '\0') {
      pp_Var7 = __ctype_tolower_loc();
      p_Var1 = *pp_Var7;
      pcVar14 = pcVar6;
      do {
        *pcVar14 = (char)p_Var1[cVar13];
        cVar13 = pcVar14[1];
        pcVar14 = pcVar14 + 1;
      } while (cVar13 != '\0');
    }
    pcVar14 = "epoll";
    iVar3 = strcmp(pcVar6,"epoll");
    if (iVar3 != 0) {
      pcVar14 = "select";
      iVar3 = strcmp(pcVar6,"select");
      if (iVar3 != 0) {
        fprintf(_stderr,
                "Warning:  Specified CM/EVPath control module \"%s\" unknown or not built.\n",
                control_module);
        free(pcVar6);
        goto LAB_00118885;
      }
    }
    cm->control_module_choice = pcVar14;
    free(pcVar6);
  }
  p_Var8 = (CMControlList)INT_CMmalloc(0xf8);
  p_Var8->server_thread = 0;
  (p_Var8->network_blocking_function).func = (CMPollFunc)0x0;
  (p_Var8->network_polling_function).func = (CMPollFunc)0x0;
  p_Var8->polling_function_list = (func_entry *)0x0;
  p_Var8->select_data = (void *)0x0;
  p_Var8->add_select = (CMAddSelectFunc)0x0;
  p_Var8->remove_select = (CMRemoveSelectFunc)0x0;
  p_Var8->cl_consistency_number = 1;
  p_Var8->select_initialized = 0;
  p_Var8->cl_reference_count = 1;
  p_Var8->free_reference_count = 1;
  pthread_mutex_init((pthread_mutex_t *)&p_Var8->list_mutex,(pthread_mutexattr_t *)0x0);
  p_Var8->condition_list = (CMCondition)0x0;
  p_Var8->next_condition_num = 1;
  p_Var8->locked = 0;
  p_Var8->closed = 0;
  p_Var8->has_thread = 0;
  p_Var8->cond_polling = 0;
  cm->control_list = p_Var8;
  pthread_mutex_init((pthread_mutex_t *)&cm->exchange_lock,(pthread_mutexattr_t *)0x0);
  cm->locked = 0;
  cm->closed = 0;
  cm->abort_read_ahead = 0;
  cm->CMTrace_file = (FILE *)0x0;
  CMtrace_init(cm,EVerbose);
  CMinit_local_formats(cm);
  pthread_mutex_init((pthread_mutex_t *)&cm->context_lock,(pthread_mutexattr_t *)0x0);
  cm->in_format_count = 0;
  p_Var9 = (CMincoming_format_list)INT_CMmalloc(1);
  cm->in_formats = p_Var9;
  cm->reg_format_count = 0;
  pp_Var10 = (CMFormat *)INT_CMmalloc(1);
  cm->reg_formats = pp_Var10;
  cm->pending_request_max = 1;
  p_Var11 = (_pending_format_requests *)INT_CMmalloc(0x18);
  cm->pbio_requests = p_Var11;
  p_Var11->server_id = (char *)0x0;
  p_Var11->id_length = 0;
  p_Var11->condition = 0;
  p_Var11->top_request = 0;
  cm->connection_count = 0;
  pp_Var12 = (CMConnection_conflict *)INT_CMmalloc(1);
  cm->connections = pp_Var12;
  cm->reg_user_format_count = 0;
  pp_Var10 = (CMFormat *)INT_CMmalloc(1);
  cm->reg_user_formats = pp_Var10;
  cm->cm_buffer_list = (CMbuffer)0x0;
  cm->pending_data_queue = (pending_queue)0x0;
  cm->contact_lists = (attr_list *)0x0;
  cm->shutdown_functions = (func_entry *)0x0;
  cm->perf_upcall = (CMperf_upcall)0x0;
  INT_CMadd_poll(cm,process_pending_queue,(void *)0x0);
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                   ,0x354);
  EVPinit(cm);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0x356);
  return cm;
}

Assistant:

extern
CManager
INT_CManager_create_control(char *control_module)
{
    CManager cm = (CManager) INT_CMmalloc(sizeof(CManager_s));
    int atom_init = 0;

    if (!atl_mutex_initialized) {
	atl_mutex_initialized++;
	thr_mutex_init(atl_mutex);
	atl_install_mutex_funcs((atl_lock_func)atl_mutex_lock, (atl_lock_func)atl_mutex_unlock, 
				&atl_mutex);
    }
    if (cm == NULL)
	return NULL;
    memset(cm, 0, sizeof(CManager_s));

    if (atom_init == 0) {
	CM_TRANSPORT = attr_atom_from_string("CM_TRANSPORT");
	CM_CMANAGER_ID = attr_atom_from_string("CM_CMANAGER_ID");
	CM_NETWORK_POSTFIX = attr_atom_from_string("CM_NETWORK_POSTFIX");
	CM_CONN_BLOCKING = attr_atom_from_string("CM_CONN_BLOCKING");
	CM_REBWM_RLEN = attr_atom_from_string("CM_REG_BW_RUN_LEN");
	CM_REBWM_REPT = attr_atom_from_string("CM_REG_BW_REPEAT_CNT");
	CM_BW_MEASURE_INTERVAL = attr_atom_from_string("CM_BW_MEASURE_INTERVAL");
	CM_BW_MEASURE_TASK = attr_atom_from_string("CM_BW_MEASURE_TASK");
	CM_BW_MEASURED_VALUE = attr_atom_from_string("CM_BW_MEASURED_VALUE");
	CM_BW_MEASURED_COF = attr_atom_from_string("CM_BW_MEASURED_COF");
	CM_BW_MEASURE_SIZE = attr_atom_from_string("CM_BW_MEASURE_SIZE");
	CM_BW_MEASURE_SIZEINC = attr_atom_from_string("CM_BW_MEASURE_SIZEINC");
	CM_EVENT_SIZE = attr_atom_from_string("CM_EVENT_SIZE");
	CM_INCOMING_CONNECTION = attr_atom_from_string("CM_INCOMING_CONNECTION");
	CM_TRANSPORT_RELIABLE = attr_atom_from_string("CM_TRANSPORT_RELIABLE");
	CM_IP_INTERFACE = attr_atom_from_string("IP_INTERFACE");
    }

    /* initialize data structs */
    cm->transports = NULL;
    cm->initialized = 0;
    cm->reference_count = 1;
    uint64_t seed = getpid() + time(NULL);
    srand48(seed);
    cm->CManager_ID = (int)lrand48();

    char *tmp;
    if ((tmp = getenv("CMControlModule"))) {
	control_module = tmp;
    }

    if (control_module != NULL) {
	char *tmp = strdup(control_module);
	char *c;
	for (c = tmp; *c; ++c) *c = tolower(*c);
#ifdef HAVE_SYS_EPOLL_H
	if (strcmp(tmp, "epoll") == 0) {
	    cm->control_module_choice = "epoll";
	} else
#endif
	if (strcmp(tmp, "select") == 0) {
	    cm->control_module_choice = "select";
	} else {
	    fprintf(stderr, "Warning:  Specified CM/EVPath control module \"%s\" unknown or not built.\n", control_module);
	    /* force to default */
	    control_module = NULL;
	}
	free(tmp);
    }	
    if (control_module == NULL) {
#ifdef HAVE_SYS_EPOLL_H
	cm->control_module_choice = "epoll";
#else
	cm->control_module_choice = "select";
#endif
    }
    cm->control_list = CMControlList_create();
    thr_mutex_init(cm->exchange_lock);

    cm->locked = 0;
    cm->closed = 0;
    cm->abort_read_ahead = 0;
    cm->CMTrace_file = NULL;
    CMtrace_init(cm, EVerbose);
    CMinit_local_formats(cm);
    thr_mutex_init(cm->context_lock);

    cm->in_format_count = 0;
    cm->in_formats = INT_CMmalloc(1);

    cm->reg_format_count = 0;
    cm->reg_formats = INT_CMmalloc(1);

    cm->pending_request_max = 1;
    cm->pbio_requests = INT_CMmalloc(sizeof(struct _pending_format_requests));
    cm->pbio_requests[0].server_id = NULL;
    cm->pbio_requests[0].id_length = 0;
    cm->pbio_requests[0].condition = 0;
    cm->pbio_requests[0].top_request = 0;

    cm->connection_count = 0;
    cm->connections = INT_CMmalloc(1);
    cm->reg_user_format_count = 0;
    cm->reg_user_formats = INT_CMmalloc(1);
    cm->cm_buffer_list = NULL;
    cm->pending_data_queue = NULL;

    cm->contact_lists = NULL;
    cm->shutdown_functions = NULL;
    cm->perf_upcall = NULL;
    INT_CMadd_poll(cm, process_pending_queue, NULL);
#ifdef EV_INTERNAL_H
    CManager_lock(cm);
    EVPinit(cm);
    CManager_unlock(cm);
#endif
    return cm;
}